

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double insphere(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar10 = *pe;
  dVar21 = pe[1];
  dVar16 = *pa - dVar10;
  dVar9 = *pb - dVar10;
  dVar1 = *pc - dVar10;
  dVar10 = *pd - dVar10;
  dVar19 = pa[1] - dVar21;
  dVar22 = pb[1] - dVar21;
  dVar3 = pc[1] - dVar21;
  dVar21 = pd[1] - dVar21;
  dVar7 = pe[2];
  dVar13 = pa[2] - dVar7;
  dVar4 = pb[2] - dVar7;
  dVar5 = pc[2] - dVar7;
  dVar7 = pd[2] - dVar7;
  dVar8 = dVar9 * dVar3 - dVar1 * dVar22;
  dVar18 = dVar16 * dVar3 - dVar1 * dVar19;
  dVar20 = dVar16 * dVar22 - dVar9 * dVar19;
  dVar11 = dVar1 * dVar21 - dVar10 * dVar3;
  dVar12 = dVar9 * dVar21 - dVar10 * dVar22;
  dVar15 = dVar10 * dVar19 - dVar16 * dVar21;
  dVar6 = dVar13 * dVar13 + dVar16 * dVar16 + dVar19 * dVar19;
  dVar17 = dVar4 * dVar4 + dVar9 * dVar9 + dVar22 * dVar22;
  dVar14 = dVar5 * dVar5 + dVar1 * dVar1 + dVar3 * dVar3;
  dVar2 = dVar7 * dVar7 + dVar10 * dVar10 + dVar21 * dVar21;
  dVar8 = ((dVar11 * dVar13 + dVar5 * dVar15 + dVar18 * dVar7) * dVar17 -
          (dVar8 * dVar7 + (dVar4 * dVar11 - dVar12 * dVar5)) * dVar6) +
          ((dVar5 * dVar20 + (dVar13 * dVar8 - dVar18 * dVar4)) * dVar2 -
          (dVar15 * dVar4 + dVar20 * dVar7 + dVar13 * dVar12) * dVar14);
  if ((_use_inexact_arith == 0) && ((_use_static_filter == 0 || (ABS(dVar8) <= ispstaticfilter)))) {
    dVar13 = ABS(dVar13);
    dVar4 = ABS(dVar4);
    dVar5 = ABS(dVar5);
    dVar7 = ABS(dVar7);
    dVar12 = ABS(dVar10 * dVar3) + ABS(dVar1 * dVar21);
    dVar15 = ABS(dVar10 * dVar22) + ABS(dVar9 * dVar21);
    dVar11 = ABS(dVar1 * dVar22) + ABS(dVar9 * dVar3);
    dVar10 = ABS(dVar16 * dVar21) + ABS(dVar10 * dVar19);
    dVar1 = ABS(dVar1 * dVar19) + ABS(dVar16 * dVar3);
    dVar21 = ABS(dVar9 * dVar19) + ABS(dVar16 * dVar22);
    dVar21 = (dVar21 * dVar5 + dVar11 * dVar13 + dVar1 * dVar4) * dVar2 +
             (dVar10 * dVar4 + dVar7 * dVar21 + dVar15 * dVar13) * dVar14 +
             (dVar11 * dVar7 + dVar12 * dVar4 + dVar15 * dVar5) * dVar6 +
             dVar17 * (dVar12 * dVar13 + dVar10 * dVar5 + dVar1 * dVar7);
    dVar10 = isperrboundA * dVar21;
    if ((dVar8 <= dVar10) && (-dVar8 <= dVar10)) {
      dVar10 = insphereadapt(pa,pb,pc,pd,pe,dVar21);
      return dVar10;
    }
  }
  return dVar8;
}

Assistant:

REAL insphere(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
  REAL aexcey, cexaey, bexdey, dexbey;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;
  REAL det;


  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  aexbey = aex * bey;
  bexaey = bex * aey;
  ab = aexbey - bexaey;
  bexcey = bex * cey;
  cexbey = cex * bey;
  bc = bexcey - cexbey;
  cexdey = cex * dey;
  dexcey = dex * cey;
  cd = cexdey - dexcey;
  dexaey = dex * aey;
  aexdey = aex * dey;
  da = dexaey - aexdey;

  aexcey = aex * cey;
  cexaey = cex * aey;
  ac = aexcey - cexaey;
  bexdey = bex * dey;
  dexbey = dex * bey;
  bd = bexdey - dexbey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  det = (dlift * abc - clift * dab) + (blift * cda - alift * bcd);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    if (fabs(det) > ispstaticfilter) return det;
    //if (det > ispstaticfilter) return det;
    //if (det < minus_ispstaticfilter) return det;

  }

  REAL aezplus, bezplus, cezplus, dezplus;
  REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
  REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
  REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
  REAL permanent, errbound;

  aezplus = Absolute(aez);
  bezplus = Absolute(bez);
  cezplus = Absolute(cez);
  dezplus = Absolute(dez);
  aexbeyplus = Absolute(aexbey);
  bexaeyplus = Absolute(bexaey);
  bexceyplus = Absolute(bexcey);
  cexbeyplus = Absolute(cexbey);
  cexdeyplus = Absolute(cexdey);
  dexceyplus = Absolute(dexcey);
  dexaeyplus = Absolute(dexaey);
  aexdeyplus = Absolute(aexdey);
  aexceyplus = Absolute(aexcey);
  cexaeyplus = Absolute(cexaey);
  bexdeyplus = Absolute(bexdey);
  dexbeyplus = Absolute(dexbey);
  permanent = ((cexdeyplus + dexceyplus) * bezplus
               + (dexbeyplus + bexdeyplus) * cezplus
               + (bexceyplus + cexbeyplus) * dezplus)
            * alift
            + ((dexaeyplus + aexdeyplus) * cezplus
               + (aexceyplus + cexaeyplus) * dezplus
               + (cexdeyplus + dexceyplus) * aezplus)
            * blift
            + ((aexbeyplus + bexaeyplus) * dezplus
               + (bexdeyplus + dexbeyplus) * aezplus
               + (dexaeyplus + aexdeyplus) * bezplus)
            * clift
            + ((bexceyplus + cexbeyplus) * aezplus
               + (cexaeyplus + aexceyplus) * bezplus
               + (aexbeyplus + bexaeyplus) * cezplus)
            * dlift;
  errbound = isperrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return insphereadapt(pa, pb, pc, pd, pe, permanent);
}